

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

void Sbd_ManPrintObj(Sbd_Man_t *p,int Pivot)

{
  ulong uVar1;
  FILE *pFile;
  Sbd_Man_t *pSVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  word *pwVar7;
  word *p_00;
  uint local_bc;
  uint local_ac;
  word *pCtrl_3;
  word *pSims_3;
  word Row;
  word *pCtrl_2;
  word *pSims_2;
  word *pCtrl_1;
  word *pSims_1;
  word *pCtrl;
  word *pSims;
  int local_30;
  int Bit1;
  int Bit0;
  int Id;
  int k1;
  int k0;
  int k;
  int i;
  int nDivs;
  int Pivot_local;
  Sbd_Man_t *p_local;
  
  i = Pivot;
  _nDivs = p;
  iVar3 = Vec_IntEntry(p->vObj2Var,Pivot);
  k = iVar3 + 1;
  for (k0 = 0; k0 < k; k0 = k0 + 1) {
    Bit1 = Vec_IntEntry(_nDivs->vWinObjs,k0);
    printf("%3d : ",(ulong)(uint)Bit1);
    pFile = _stdout;
    pwVar7 = Sbd_ObjSim0(_nDivs,Bit1);
    Extra_PrintBinary(pFile,(uint *)pwVar7,0x40);
    printf("\n");
  }
  if (_nDivs->Pivot == i) {
    Vec_IntClear(_nDivs->vCounts[0]);
    Vec_IntClear(_nDivs->vCounts[1]);
    iVar3 = i;
    uVar4 = Vec_IntSize(_nDivs->vDivValues);
    printf("Node %d.  Useful divisors = %d.\n",(ulong)(uint)iVar3,(ulong)uVar4);
    printf("Lev : ");
    for (k0 = 0; k0 < k; k0 = k0 + 1) {
      Bit1 = Vec_IntEntry(_nDivs->vWinObjs,k0);
      if (k0 == k + -1) {
        printf(" ");
      }
      uVar4 = Vec_IntEntry(_nDivs->vLutLevs,Bit1);
      printf("%d",(ulong)uVar4);
    }
    printf("\n");
    printf("\n");
    if (99 < k) {
      printf("    : ");
      for (k0 = 0; k0 < k; k0 = k0 + 1) {
        Bit1 = Vec_IntEntry(_nDivs->vWinObjs,k0);
        if (k0 == k + -1) {
          printf(" ");
        }
        printf("%d",(long)Bit1 / 100 & 0xffffffff,(long)Bit1 % 100 & 0xffffffff);
      }
      printf("\n");
    }
    if (9 < k) {
      printf("    : ");
      for (k0 = 0; k0 < k; k0 = k0 + 1) {
        Bit1 = Vec_IntEntry(_nDivs->vWinObjs,k0);
        if (k0 == k + -1) {
          printf(" ");
        }
        uVar1 = (ulong)(uint)((int)((long)Bit1 % 100) >> 0x1f) << 0x20 |
                (long)Bit1 % 100 & 0xffffffffU;
        printf("%d",(long)uVar1 / 10 & 0xffffffff,(long)uVar1 % 10 & 0xffffffff);
      }
      printf("\n");
    }
    if (0 < k) {
      printf("    : ");
      for (k0 = 0; k0 < k; k0 = k0 + 1) {
        Bit1 = Vec_IntEntry(_nDivs->vWinObjs,k0);
        if (k0 == k + -1) {
          printf(" ");
        }
        printf("%d",(long)Bit1 % 10 & 0xffffffff);
      }
      printf("\n");
      printf("\n");
    }
    for (k1 = 0; k1 < _nDivs->pPars->nWords * 0x40; k1 = k1 + 1) {
      pwVar7 = Sbd_ObjSim2(_nDivs,i);
      iVar3 = Abc_TtGetBit(pwVar7,k1);
      if (iVar3 != 0) {
        printf("%3d : ",(ulong)(uint)k1);
        for (k0 = 0; k0 < k; k0 = k0 + 1) {
          Bit1 = Vec_IntEntry(_nDivs->vWinObjs,k0);
          pCtrl = Sbd_ObjSim0(_nDivs,Bit1);
          pSims_1 = Sbd_ObjSim2(_nDivs,Bit1);
          if (k0 == k + -1) {
            iVar3 = Abc_TtGetBit(pSims_1,k1);
            pSVar2 = _nDivs;
            if (iVar3 != 0) {
              iVar3 = Abc_TtGetBit(pCtrl,k1);
              Vec_IntPush(pSVar2->vCounts[iVar3],k1);
            }
            printf(" ");
          }
          iVar3 = Abc_TtGetBit(pSims_1,k1);
          if (iVar3 == 0) {
            local_ac = 0x2e;
          }
          else {
            iVar3 = Abc_TtGetBit(pCtrl,k1);
            local_ac = iVar3 + 0x30;
          }
          printf("%c",(ulong)local_ac);
        }
        printf("\n");
        printf("%3d : ",(ulong)(uint)k1);
        for (k0 = 0; k0 < k; k0 = k0 + 1) {
          Bit1 = Vec_IntEntry(_nDivs->vWinObjs,k0);
          pCtrl_1 = Sbd_ObjSim0(_nDivs,Bit1);
          pSims_2 = Sbd_ObjSim3(_nDivs,Bit1);
          if (k0 == k + -1) {
            iVar3 = Abc_TtGetBit(pSims_2,k1);
            pSVar2 = _nDivs;
            if (iVar3 != 0) {
              iVar3 = Abc_TtGetBit(pCtrl_1,k1);
              Vec_IntPush(pSVar2->vCounts[iVar3],k1);
            }
            printf(" ");
          }
          iVar3 = Abc_TtGetBit(pSims_2,k1);
          if (iVar3 == 0) {
            local_bc = 0x2e;
          }
          else {
            iVar3 = Abc_TtGetBit(pCtrl_1,k1);
            local_bc = iVar3 + 0x30;
          }
          printf("%c",(ulong)local_bc);
        }
        printf("\n");
        printf("Sims: ");
        for (k0 = 0; k0 < k; k0 = k0 + 1) {
          Bit1 = Vec_IntEntry(_nDivs->vWinObjs,k0);
          pCtrl_2 = Sbd_ObjSim0(_nDivs,Bit1);
          if (k0 == k + -1) {
            printf(" ");
          }
          iVar3 = Abc_TtGetBit(pCtrl_2,k1);
          printf("%c",(ulong)(iVar3 + 0x30));
        }
        printf("\n");
        printf("Ctrl: ");
        for (k0 = 0; k0 < k; k0 = k0 + 1) {
          Bit1 = Vec_IntEntry(_nDivs->vWinObjs,k0);
          Row = (word)Sbd_ObjSim2(_nDivs,Bit1);
          if (k0 == k + -1) {
            printf(" ");
          }
          iVar3 = Abc_TtGetBit((word *)Row,k1);
          printf("%c",(ulong)(iVar3 + 0x30));
        }
        printf("\n");
        printf("\n");
      }
    }
    uVar4 = Vec_IntSize(_nDivs->vCounts[0]);
    uVar5 = Vec_IntSize(_nDivs->vCounts[1]);
    printf("Exploring %d x %d covering table.\n",(ulong)uVar4,(ulong)uVar5);
    Vec_WrdClear(_nDivs->vMatrix);
    Id = 0;
    while( true ) {
      iVar3 = Id;
      iVar6 = Vec_IntSize(_nDivs->vCounts[0]);
      iVar6 = Abc_MinInt(iVar6,0x40);
      if (iVar6 <= iVar3) break;
      local_30 = Vec_IntEntry(_nDivs->vCounts[0],Id);
      Bit0 = 0;
      while( true ) {
        iVar3 = Bit0;
        iVar6 = Vec_IntSize(_nDivs->vCounts[1]);
        iVar6 = Abc_MinInt(iVar6,0x40);
        if (iVar6 <= iVar3) break;
        pSims._4_4_ = Vec_IntEntry(_nDivs->vCounts[1],Bit0);
        pSims_3 = (word *)0x0;
        for (k0 = 0; k0 < k; k0 = k0 + 1) {
          Bit1 = Vec_IntEntry(_nDivs->vWinObjs,k0);
          pwVar7 = Sbd_ObjSim0(_nDivs,Bit1);
          p_00 = Sbd_ObjSim2(_nDivs,Bit1);
          iVar3 = Abc_TtGetBit(p_00,local_30);
          if ((iVar3 != 0) && (iVar3 = Abc_TtGetBit(p_00,pSims._4_4_), iVar3 != 0)) {
            iVar3 = Abc_TtGetBit(pwVar7,local_30);
            iVar6 = Abc_TtGetBit(pwVar7,pSims._4_4_);
            if (iVar3 != iVar6) {
              Abc_TtXorBit((word *)&pSims_3,k0);
            }
          }
        }
        iVar3 = Vec_WrdPushUnique(_nDivs->vMatrix,(word)pSims_3);
        if (iVar3 == 0) {
          for (k0 = 0; k0 < k; k0 = k0 + 1) {
            printf("%d",(ulong)((uint)((ulong)pSims_3 >> ((byte)k0 & 0x3f)) & 1));
          }
          printf("\n");
        }
        Bit0 = Bit0 + 1;
      }
      Id = Id + 1;
    }
    return;
  }
  __assert_fail("p->Pivot == Pivot",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                ,0x29b,"void Sbd_ManPrintObj(Sbd_Man_t *, int)");
}

Assistant:

void Sbd_ManPrintObj( Sbd_Man_t * p, int Pivot )
{
    int nDivs = Vec_IntEntry(p->vObj2Var, Pivot) + 1;
    int i, k, k0, k1, Id, Bit0, Bit1;

    Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        printf( "%3d : ", Id ), Extra_PrintBinary( stdout, (unsigned *)Sbd_ObjSim0(p, Id), 64 ), printf( "\n" );

    assert( p->Pivot == Pivot );
    Vec_IntClear( p->vCounts[0] );
    Vec_IntClear( p->vCounts[1] );

    printf( "Node %d.  Useful divisors = %d.\n", Pivot, Vec_IntSize(p->vDivValues) );
    printf( "Lev : " );
    Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
    {
        if ( i == nDivs-1 )
            printf( " " );
        printf( "%d", Vec_IntEntry(p->vLutLevs, Id) );
    }
    printf( "\n" );
    printf( "\n" );

    if ( nDivs > 99 )
    {
        printf( "    : " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%d", Id / 100 );
        }
        printf( "\n" );
    }
    if ( nDivs > 9 )
    {
        printf( "    : " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%d", (Id % 100) / 10 );
        }
        printf( "\n" );
    }
    if ( nDivs > 0 )
    {
        printf( "    : " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%d", Id % 10 );
        }
        printf( "\n" );
        printf( "\n" );
    }

    // sampling matrix
    for ( k = 0; k < p->pPars->nWords * 64; k++ )
    {
        if ( !Abc_TtGetBit(Sbd_ObjSim2(p, Pivot), k) )
            continue;

        printf( "%3d : ", k );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( i == nDivs-1 )
            {
                if ( Abc_TtGetBit(pCtrl, k) )
                    Vec_IntPush( p->vCounts[Abc_TtGetBit(pSims, k)], k );
                printf( " " );
            }
            printf( "%c", Abc_TtGetBit(pCtrl, k) ? '0' + Abc_TtGetBit(pSims, k) : '.' );
        }
        printf( "\n" );

        printf( "%3d : ", k );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim3( p, Id );
            if ( i == nDivs-1 )
            {
                if ( Abc_TtGetBit(pCtrl, k) )
                    Vec_IntPush( p->vCounts[Abc_TtGetBit(pSims, k)], k );
                printf( " " );
            }
            printf( "%c", Abc_TtGetBit(pCtrl, k) ? '0' + Abc_TtGetBit(pSims, k) : '.' );
        }
        printf( "\n" );

        printf( "Sims: " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            //word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%c", '0' + Abc_TtGetBit(pSims, k) );
        }
        printf( "\n" );

        printf( "Ctrl: " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            //word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%c", '0' + Abc_TtGetBit(pCtrl, k) );
        }
        printf( "\n" );


        printf( "\n" );
    }
    // covering table
    printf( "Exploring %d x %d covering table.\n", Vec_IntSize(p->vCounts[0]), Vec_IntSize(p->vCounts[1]) );
/*
    Vec_IntForEachEntryStop( p->vCounts[0], Bit0, k0, Abc_MinInt(Vec_IntSize(p->vCounts[0]), 8) )
    Vec_IntForEachEntryStop( p->vCounts[1], Bit1, k1, Abc_MinInt(Vec_IntSize(p->vCounts[1]), 8) )
    {
        printf( "%3d %3d : ", Bit0, Bit1 );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%c", (Abc_TtGetBit(pCtrl, Bit0) && Abc_TtGetBit(pCtrl, Bit1) && Abc_TtGetBit(pSims, Bit0) != Abc_TtGetBit(pSims, Bit1)) ? '1' : '.' );
        }
        printf( "\n" );
    }
*/
    Vec_WrdClear( p->vMatrix );
    Vec_IntForEachEntryStop( p->vCounts[0], Bit0, k0, Abc_MinInt(Vec_IntSize(p->vCounts[0]), 64) )
    Vec_IntForEachEntryStop( p->vCounts[1], Bit1, k1, Abc_MinInt(Vec_IntSize(p->vCounts[1]), 64) )
    {
        word Row = 0;
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( Abc_TtGetBit(pCtrl, Bit0) && Abc_TtGetBit(pCtrl, Bit1) && Abc_TtGetBit(pSims, Bit0) != Abc_TtGetBit(pSims, Bit1) )
                Abc_TtXorBit( &Row, i );
        }
        if ( Vec_WrdPushUnique( p->vMatrix, Row ) )
            continue;
        for ( i = 0; i < nDivs; i++ )
            printf( "%d", (int)((Row >> i) & 1) );
        printf( "\n" );
    }
}